

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

Vec_Wec_t * Gia_Iso2ManDerivePoClasses(Gia_Man_t *pGia)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vMap_00;
  Vec_Wec_t *pVVar2;
  bool bVar3;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vMap;
  Vec_Int_t *vValues;
  Vec_Wec_t *vEquivs;
  Gia_Man_t *pGia_local;
  
  iVar1 = Gia_ManPoNum(pGia);
  p = Vec_IntAlloc(iVar1);
  local_34 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(pGia);
    bVar3 = false;
    if (local_34 < iVar1) {
      pGStack_30 = Gia_ManCo(pGia,local_34);
      bVar3 = pGStack_30 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    Vec_IntPush(p,pGStack_30->Value);
    local_34 = local_34 + 1;
  }
  vMap_00 = Hsh_IntManHashArray(p,1);
  Vec_IntFree(p);
  pVVar2 = Vec_WecCreateClasses(vMap_00);
  Vec_IntFree(vMap_00);
  return pVVar2;
}

Assistant:

Vec_Wec_t * Gia_Iso2ManDerivePoClasses( Gia_Man_t * pGia )
{
    Vec_Wec_t * vEquivs;
    Vec_Int_t * vValues;
    Vec_Int_t * vMap;
    Gia_Obj_t * pObj;
    int i;
    vValues = Vec_IntAlloc( Gia_ManPoNum(pGia) );
    Gia_ManForEachPo( pGia, pObj, i )
        Vec_IntPush( vValues, pObj->Value );
    vMap = Hsh_IntManHashArray( vValues, 1 );
    Vec_IntFree( vValues );
    vEquivs = Vec_WecCreateClasses( vMap );
    Vec_IntFree( vMap );
    return vEquivs;    
}